

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O0

Aig_Man_t * Saig_ManDupWithPhase(Aig_Man_t *pAig,Vec_Int_t *vInit)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *p1;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigNew;
  Vec_Int_t *vInit_local;
  Aig_Man_t *pAig_local;
  
  iVar2 = Aig_ManRegNum(pAig);
  iVar3 = Vec_IntSize(vInit);
  if (iVar3 < iVar2) {
    __assert_fail("Aig_ManRegNum(pAig) <= Vec_IntSize(vInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigDup.c"
                  ,0x1e5,"Aig_Man_t *Saig_ManDupWithPhase(Aig_Man_t *, Vec_Int_t *)");
  }
  iVar2 = Aig_ManNodeNum(pAig);
  p = Aig_ManStart(iVar2);
  pcVar4 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar4;
  p->nConstrs = pAig->nConstrs;
  pAVar5 = Aig_ManConst1(p);
  pAVar6 = Aig_ManConst1(pAig);
  (pAVar6->field_5).pData = pAVar5;
  for (local_2c = 0; iVar2 = Vec_PtrSize(pAig->vCis), local_2c < iVar2; local_2c = local_2c + 1) {
    pvVar7 = Vec_PtrEntry(pAig->vCis,local_2c);
    pAVar5 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_2c = 0; iVar2 = Saig_ManRegNum(pAig), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar1 = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pvVar7 = Vec_PtrEntry(pVVar1,local_2c + iVar2);
    pAVar5 = *(Aig_Obj_t **)((long)pvVar7 + 0x28);
    iVar2 = Vec_IntEntry(vInit,local_2c);
    pAVar5 = Aig_NotCond(pAVar5,iVar2);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_2c = 0; iVar2 = Vec_PtrSize(pAig->vObjs), local_2c < iVar2; local_2c = local_2c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_2c);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      p1 = Aig_ObjChild1Copy(pAVar5);
      pAVar6 = Aig_And(p,pAVar6,p1);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  for (local_2c = 0; iVar2 = Saig_ManPoNum(pAig), local_2c < iVar2; local_2c = local_2c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_2c);
    pAVar5 = Aig_ObjChild0Copy(pAVar5);
    Aig_ObjCreateCo(p,pAVar5);
  }
  for (local_2c = 0; iVar2 = Saig_ManRegNum(pAig), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar1 = pAig->vCos;
    iVar2 = Saig_ManPoNum(pAig);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_2c + iVar2);
    pAVar5 = Aig_ObjChild0Copy(pAVar5);
    iVar2 = Vec_IntEntry(vInit,local_2c);
    pAVar5 = Aig_NotCond(pAVar5,iVar2);
    Aig_ObjCreateCo(p,pAVar5);
  }
  Aig_ManCleanup(p);
  iVar2 = Aig_ManRegNum(pAig);
  Aig_ManSetRegNum(p,iVar2);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManDupWithPhase( Aig_Man_t * pAig, Vec_Int_t * vInit )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(pAig) <= Vec_IntSize(vInit) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // update the flop variables
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)pObj->pData, Vec_IntEntry(vInit, i) );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // transfer to register outputs
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // update the flop variables
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_NotCond(Aig_ObjChild0Copy(pObj), Vec_IntEntry(vInit, i)) );
    // finalize
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}